

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O1

int Dch_ClassesRefineConst1Group(Dch_Cla_t *p,Vec_Ptr_t *vRoots,int fRecursive)

{
  uint uVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t **ppAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t **ppAVar6;
  int iVar7;
  void **ppvVar8;
  int iVar9;
  Vec_Ptr_t *pVVar10;
  Aig_Obj_t *pAVar11;
  long lVar12;
  
  iVar7 = 0;
  if (vRoots->nSize != 0) {
    p->vClassNew->nSize = 0;
    if (0 < vRoots->nSize) {
      lVar12 = 0;
      do {
        pAVar3 = (Aig_Obj_t *)vRoots->pArray[lVar12];
        iVar7 = (*p->pFuncNodeIsConst)(p->pManData,pAVar3);
        if (iVar7 == 0) {
          pVVar10 = p->vClassNew;
          uVar1 = pVVar10->nCap;
          if (pVVar10->nSize == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (pVVar10->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(0x80);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar10->pArray,0x80);
              }
              pVVar10->pArray = ppvVar8;
              iVar7 = 0x10;
            }
            else {
              iVar7 = uVar1 * 2;
              if (iVar7 <= (int)uVar1) goto LAB_008fcc65;
              if (pVVar10->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar10->pArray,(ulong)uVar1 << 4);
              }
              pVVar10->pArray = ppvVar8;
            }
            pVVar10->nCap = iVar7;
          }
LAB_008fcc65:
          iVar7 = pVVar10->nSize;
          pVVar10->nSize = iVar7 + 1;
          pVVar10->pArray[iVar7] = pAVar3;
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < vRoots->nSize);
    }
    iVar2 = p->vClassNew->nSize;
    iVar7 = 0;
    if (iVar2 != 0) {
      p->nCands1 = p->nCands1 - iVar2;
      if (iVar2 < 1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      ppAVar4 = p->pAig->pReprs;
      if (ppAVar4 == (Aig_Obj_t **)0x0) {
LAB_008fcd9f:
        __assert_fail("p->pReprs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
      pAVar3 = (Aig_Obj_t *)*p->vClassNew->pArray;
      iVar2 = pAVar3->Id;
      ppAVar4[iVar2] = (Aig_Obj_t *)0x0;
      lVar12 = (long)p->vClassNew->nSize;
      iVar7 = 1;
      if (lVar12 != 1) {
        ppAVar4 = p->pMemClassesFree;
        pVVar10 = p->vClassNew;
        p->pMemClassesFree = ppAVar4 + lVar12;
        iVar9 = pVVar10->nSize;
        if (0 < iVar9) {
          lVar12 = 0;
          do {
            pAVar5 = (Aig_Obj_t *)pVVar10->pArray[lVar12];
            ppAVar4[lVar12] = pAVar5;
            ppAVar6 = p->pAig->pReprs;
            if (ppAVar6 == (Aig_Obj_t **)0x0) goto LAB_008fcd9f;
            pAVar11 = pAVar3;
            if (lVar12 == 0) {
              pAVar11 = (Aig_Obj_t *)0x0;
            }
            ppAVar6[pAVar5->Id] = pAVar11;
            lVar12 = lVar12 + 1;
            pVVar10 = p->vClassNew;
            iVar9 = pVVar10->nSize;
          } while (lVar12 < iVar9);
        }
        if (p->pId2Class[iVar2] != (Aig_Obj_t **)0x0) {
          __assert_fail("p->pId2Class[pRepr->Id] == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                        ,0x5c,"void Dch_ObjAddClass(Dch_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
        }
        p->pId2Class[iVar2] = ppAVar4;
        if (p->pClassSizes[iVar2] != 0) {
          __assert_fail("p->pClassSizes[pRepr->Id] == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                        ,0x5e,"void Dch_ObjAddClass(Dch_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
        }
        if (iVar9 < 2) {
          __assert_fail("nSize > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchClass.c"
                        ,0x5f,"void Dch_ObjAddClass(Dch_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
        }
        p->pClassSizes[iVar2] = iVar9;
        p->nClasses = p->nClasses + 1;
        p->nLits = p->nLits + iVar9 + -1;
        if (fRecursive != 0) {
          iVar7 = Dch_ClassesRefineOneClass(p,pAVar3,1);
          iVar7 = iVar7 + 1;
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int Dch_ClassesRefineConst1Group( Dch_Cla_t * p, Vec_Ptr_t * vRoots, int fRecursive )
{
    Aig_Obj_t * pObj, * pReprNew, ** ppClassNew;
    int i;
    if ( Vec_PtrSize(vRoots) == 0 )
        return 0;
    // collect the nodes to be refined
    Vec_PtrClear( p->vClassNew );
    Vec_PtrForEachEntry( Aig_Obj_t *, vRoots, pObj, i )
        if ( !p->pFuncNodeIsConst( p->pManData, pObj ) )
            Vec_PtrPush( p->vClassNew, pObj );
    // check if there is a new class
    if ( Vec_PtrSize(p->vClassNew) == 0 )
        return 0;
    p->nCands1 -= Vec_PtrSize(p->vClassNew);
    pReprNew = (Aig_Obj_t *)Vec_PtrEntry( p->vClassNew, 0 );
    Aig_ObjSetRepr( p->pAig, pReprNew, NULL );
    if ( Vec_PtrSize(p->vClassNew) == 1 )
        return 1;
    // create a new class composed of these nodes
    ppClassNew = p->pMemClassesFree;
    p->pMemClassesFree += Vec_PtrSize(p->vClassNew);
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
    {
        ppClassNew[i] = pObj;
        Aig_ObjSetRepr( p->pAig, pObj, i? pReprNew : NULL );
    }
    Dch_ObjAddClass( p, pReprNew, ppClassNew, Vec_PtrSize(p->vClassNew) );
    // refine them recursively
    if ( fRecursive )
        return 1 + Dch_ClassesRefineOneClass( p, pReprNew, 1 );
    return 1;
}